

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O3

ssize_t __thiscall Excel::Record::read(Record *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *retVal;
  iterator __position;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t sVar3;
  ssize_t extraout_RAX;
  Exception *pEVar4;
  ushort uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  Stream *this_00;
  uint16_t nextRecordCode;
  uint16_t nextRecordLength;
  vector<char,_std::allocator<char>_> data;
  unsigned_short local_7c;
  unsigned_short local_7a;
  vector<char,_std::allocator<char>_> local_78;
  wstring local_58;
  vector<int,_std::allocator<int>_> *local_38;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  Stream::read<unsigned_short>(this_00,&this->m_code,2);
  retVal = &this->m_length;
  Stream::read<unsigned_int>(this_00,retVal,2);
  local_7c = 0;
  local_7a = 0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  if (((ulong)this->m_length != 0) &&
     (std::vector<char,_std::allocator<char>_>::reserve(&local_78,(ulong)this->m_length),
     *retVal != 0)) {
    uVar6 = 0;
    do {
      iVar1 = (*this_00->_vptr_Stream[2])(this_00);
      local_58._M_dataplus._M_p._0_1_ = (char)iVar1;
      if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char *)&local_58);
      }
      else {
        *local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish = (char)iVar1;
        local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar1 = (*this_00->_vptr_Stream[3])(this_00);
      if ((char)iVar1 != '\0') {
        pEVar4 = (Exception *)__cxa_allocate_exception(0x30);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_58,L"Unexpected end of file.",L"");
        Exception::Exception(pEVar4,&local_58);
        __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < *retVal);
  }
  Stream::read<unsigned_short>(this_00,&local_7c,2);
  if (local_7c == 0x3c) {
    local_38 = &this->m_borders;
    do {
      local_58._M_dataplus._M_p._0_4_ = this->m_length;
      __position._M_current =
           (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_38,__position,(int *)&local_58);
      }
      else {
        *__position._M_current = this->m_length;
        (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      Stream::read<unsigned_short>(this_00,&local_7a,2);
      std::vector<char,_std::allocator<char>_>::reserve
                (&local_78,
                 (size_type)
                 (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                 ((ulong)local_7a -
                 (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start)));
      if (local_7a == 0) {
        uVar2 = 0;
      }
      else {
        uVar5 = 0;
        do {
          iVar1 = (*this_00->_vptr_Stream[2])(this_00);
          local_58._M_dataplus._M_p._0_1_ = (char)iVar1;
          if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char *)&local_58);
          }
          else {
            *local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = (char)iVar1;
            local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          iVar1 = (*this_00->_vptr_Stream[3])(this_00);
          if ((char)iVar1 != '\0') {
            pEVar4 = (Exception *)__cxa_allocate_exception(0x30);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::wstring::_M_construct<wchar_t_const*>
                      ((wstring *)&local_58,L"Unexpected end of file.",L"");
            Exception::Exception(pEVar4,&local_58);
            __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
          }
          uVar5 = uVar5 + 1;
          uVar2 = (uint)local_7a;
        } while (uVar5 < local_7a);
      }
      *retVal = *retVal + uVar2;
      Stream::read<unsigned_short>(this_00,&local_7c,2);
    } while (local_7c == 0x3c);
  }
  iVar1 = (*this_00->_vptr_Stream[3])(this_00);
  sVar3 = CONCAT44(extraout_var,iVar1);
  if ((char)iVar1 == '\0') {
    iVar1 = (*this_00->_vptr_Stream[4])(this_00,0xfffffffe,1);
    sVar3 = CONCAT44(extraout_var_00,iVar1);
  }
  if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    sVar3 = std::ostream::write(&(this->m_stream).field_0x20,
                                (long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    sVar3 = extraout_RAX;
  }
  return sVar3;
}

Assistant:

inline void
Record::read( Stream & stream )
{
	stream.read( m_code, 2 );
	stream.read( m_length, 2 );

	uint16_t nextRecordCode = 0;
	uint16_t nextRecordLength = 0;

	std::vector< char > data;

	if( m_length )
	{
		data.reserve( m_length );

		for( size_t i = 0; i < m_length; ++i )
		{
			data.push_back( stream.getByte() );

			if( stream.eof() )
				throw Exception( L"Unexpected end of file." );
		}
	}

	try {
		stream.read( nextRecordCode, 2 );
	}
	catch( const Exception & )
	{
		nextRecordCode = XL_UNKNOWN;
	}

	while( nextRecordCode == XL_CONTINUE )
	{
		m_borders.push_back( m_length );

		stream.read( nextRecordLength, 2 );

		data.reserve( data.size() + nextRecordLength );

		if( nextRecordLength )
		{
			for( uint16_t i = 0; i < nextRecordLength; ++i )
			{
				data.push_back( stream.getByte() );

				if( stream.eof() )
					throw Exception( L"Unexpected end of file." );
			}
		}

		m_length += nextRecordLength;

		try {
			stream.read( nextRecordCode, 2 );
		}
		catch( const Exception & )
		{
			nextRecordCode = XL_UNKNOWN;
		}
	}

	if( !stream.eof() )
		stream.seek( -2, Stream::FromCurrent );

	if( data.size() )
		m_stream.write( &data[ 0 ], data.size() );
}